

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedSingleFileIndexedStorage.hpp
# Opt level: O0

optional<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_> * __thiscall
supermap::
SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>
::find(SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>
       *this,Key<128UL> *pattern,
      function<bool_(const_supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_&,_const_supermap::Key<128UL>_&)>
      *less,function<bool_(const_supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_&,_const_supermap::Key<128UL>_&)>
            *equal)

{
  bool bVar1;
  long lVar2;
  optional<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_> *poVar3;
  function<bool_(const_supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_&,_const_supermap::Key<128UL>_&)>
  *in_RCX;
  long *in_RSI;
  optional<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_> *in_RDI;
  KeyValue<supermap::Key<128UL>,_unsigned_long> *in_R8;
  KeyValue<supermap::Key<128UL>,_unsigned_long> firstLeqElem;
  KeyValue<supermap::Key<128UL>,_unsigned_long> middleElem;
  unsigned_long middle;
  unsigned_long lastGt;
  unsigned_long firstLeq;
  KeyValue<supermap::Key<128UL>,_unsigned_long> *in_stack_fffffffffffffe68;
  Key<128UL> *in_stack_fffffffffffffe70;
  optional<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_> *this_00;
  undefined1 local_158 [144];
  undefined1 local_c8 [136];
  optional<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_> *local_40;
  optional<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_> *local_38;
  optional<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_> *local_30;
  
  lVar2 = (**(code **)(*in_RSI + 8))();
  if (lVar2 == 0) {
    std::optional<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_>::optional(in_RDI);
  }
  else {
    local_30 = (optional<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_> *)0x0;
    local_38 = (optional<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_> *)
               (**(code **)(*in_RSI + 8))();
    while (1 < (ulong)((long)local_38 - (long)local_30)) {
      local_40 = (optional<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_> *)
                 ((ulong)((long)&(local_30->
                                 super__Optional_base<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_true,_true>
                                 )._M_payload.
                                 super__Optional_payload_base<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_>
                                 ._M_payload +
                         (long)&(local_38->
                                super__Optional_base<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_true,_true>
                                )._M_payload.
                                super__Optional_payload_base<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_>
                                ._M_payload) >> 1);
      (**(code **)(*in_RSI + 0x20))(local_c8,in_RSI,local_40);
      bVar1 = std::
              function<bool_(const_supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_&,_const_supermap::Key<128UL>_&)>
              ::operator()(in_RCX,in_R8,in_stack_fffffffffffffe70);
      if ((bVar1) ||
         (bVar1 = std::
                  function<bool_(const_supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_&,_const_supermap::Key<128UL>_&)>
                  ::operator()(in_RCX,in_R8,in_stack_fffffffffffffe70), bVar1)) {
        local_30 = local_40;
      }
      else {
        local_38 = local_40;
      }
    }
    this_00 = local_30;
    poVar3 = (optional<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_> *)
             (**(code **)(*in_RSI + 8))();
    if (this_00 < poVar3) {
      (**(code **)(*in_RSI + 0x20))(local_158,in_RSI,local_30);
      bVar1 = std::
              function<bool_(const_supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_&,_const_supermap::Key<128UL>_&)>
              ::operator()(in_RCX,in_R8,(Key<128UL> *)this_00);
      if (bVar1) {
        std::optional<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_>::
        optional<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_&,_true>
                  (this_00,in_stack_fffffffffffffe68);
      }
      else {
        std::optional<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_>::optional(in_RDI);
      }
    }
    else {
      std::optional<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_>::optional(in_RDI);
    }
  }
  return in_RDI;
}

Assistant:

std::optional<T> find(
        const FindPattern &pattern,
        std::function<bool(const T &, const FindPattern &)> less,
        std::function<bool(const T &, const FindPattern &)> equal
    ) override {
        if (getItemsCount() == 0) {
            return std::nullopt;
        }
        IndexT firstLeq = 0;
        IndexT lastGt = getItemsCount();
        while (lastGt - firstLeq > 1) {
            IndexT middle = (firstLeq + lastGt) / 2;
            T middleElem = get(middle);
            if (less(middleElem, pattern) || equal(middleElem, pattern)) {
                firstLeq = middle;
            } else {
                lastGt = middle;
            }
        }
        if (firstLeq >= getItemsCount()) {
            return std::nullopt;
        }
        T firstLeqElem = get(firstLeq);
        return equal(firstLeqElem, pattern) ? std::optional{firstLeqElem} : std::nullopt;
    }